

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall zmq::array_t<zmq::pipe_t,_1>::push_back(array_t<zmq::pipe_t,_1> *this,pipe_t *item_)

{
  pointer *ppppVar1;
  iterator __position;
  pipe_t *local_8;
  
  if (item_ != (pipe_t *)0x0) {
    (item_->super_array_item_t<1>)._array_index =
         (int)((ulong)((long)(this->_items).
                             super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_items).
                            super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  __position._M_current =
       (this->_items).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_items).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = item_;
    std::vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>>::_M_realloc_insert<zmq::pipe_t*const&>
              ((vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>> *)this,__position,&local_8);
  }
  else {
    *__position._M_current = item_;
    ppppVar1 = &(this->_items).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *ppppVar1 = *ppppVar1 + 1;
  }
  return;
}

Assistant:

void push_back (T *item_)
    {
        if (item_)
            static_cast<item_t *> (item_)->set_array_index (
              static_cast<int> (_items.size ()));
        _items.push_back (item_);
    }